

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relayer.cpp
# Opt level: O2

void __thiscall TcpRelayer::onAccept(TcpRelayer *this,Connection *conn)

{
  TcpClient *this_00;
  TimerId TVar1;
  RelayerContext context;
  shared_ptr<Liby::TcpClient> tcpClient;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  TcpClient *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [8];
  RelayerContext local_68;
  TimerId local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  
  Liby::EventLoopGroup::creatTcpClient
            ((EventLoopGroup *)&local_80,(string *)this->group_,&this->host_);
  this_00 = local_80;
  local_48[0]._M_allocated_capacity = 8;
  local_48[0]._8_8_ = 0;
  std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)local_98,
             (__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
  std::function<void()>::function<TcpRelayer::onAccept(Liby::Connection&)::_lambda()_1_,void>
            ((function<void()> *)local_70,(anon_class_16_1_0de0f9ac *)local_98);
  TVar1 = Liby::TimerMixin::runAfter
                    (&this_00->super_TimerMixin,(Timestamp *)local_48,(BasicHandler *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  local_98 = (undefined1  [8])&PTR__RelayerContext_00131180;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_70,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>);
  std::__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  local_70 = (undefined1  [8])this;
  RelayerContext::RelayerContext((RelayerContext *)(local_70 + 8),(RelayerContext *)local_98);
  local_50 = TVar1;
  std::function<void(std::shared_ptr<Liby::Connection>)>::
  function<TcpRelayer::onAccept(Liby::Connection&)::_lambda(std::shared_ptr<Liby::Connection>)_1_,void>
            ((function<void(std::shared_ptr<Liby::Connection>)> *)local_48[0]._M_local_buf,
             (anon_class_40_3_155447e0 *)local_70);
  Liby::TcpClient::onConnect(local_80,(Connector *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  RelayerContext::~RelayerContext((RelayerContext *)(local_70 + 8));
  RelayerContext::~RelayerContext((RelayerContext *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  return;
}

Assistant:

void onAccept(Connection &conn) {
        shared_ptr<TcpClient> tcpClient =
            group_.creatTcpClient(host_, service_);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        RelayerContext context;
        context.weak_conn = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                RelayerContext context1;
                context1.weak_conn = c;
                c->context_ = make_shared<RelayerContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<RelayerContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }